

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

shared_ptr<minja::Expression> __thiscall minja::Parser::parseLogicalNot(Parser *this)

{
  undefined8 uVar1;
  int iVar2;
  runtime_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  Parser *in_RSI;
  shared_ptr<minja::Expression> sVar4;
  shared_ptr<minja::Expression> sub;
  Location location;
  undefined1 local_69;
  undefined1 local_68 [32];
  Location local_48;
  Op local_2c;
  UnaryOpExpr *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  if (parseLogicalNot()::not_tok_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&parseLogicalNot()::not_tok_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&parseLogicalNot()::not_tok_abi_cxx11_,"not\\b",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseLogicalNot()::not_tok_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseLogicalNot()::not_tok_abi_cxx11_);
    }
  }
  local_48.source.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (in_RSI->template_str).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_48.source.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (in_RSI->template_str).
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_48.source.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.source.
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_48.source.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.source.
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_48.source.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_48.pos = (long)(in_RSI->it)._M_current - (long)(in_RSI->start)._M_current;
  consumeToken((string *)local_68,in_RSI,&parseLogicalNot()::not_tok_abi_cxx11_,Strip);
  uVar1 = local_68._8_8_;
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1 ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    sVar4 = parseLogicalCompare(this);
    _Var3 = sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  }
  else {
    parseLogicalNot((Parser *)local_68);
    if ((pointer)local_68._0_8_ == (pointer)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Expected expression after \'not\' keyword");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_2c = LogicalNot;
    local_28 = (UnaryOpExpr *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<minja::UnaryOpExpr,std::allocator<minja::UnaryOpExpr>,minja::Location&,std::shared_ptr<minja::Expression>,minja::UnaryOpExpr::Op>
              (&_Stack_20,&local_28,(allocator<minja::UnaryOpExpr> *)&local_69,&local_48,
               (shared_ptr<minja::Expression> *)local_68,&local_2c);
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_28;
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Stack_20._M_pi;
    _Var3._M_pi = extraout_RDX;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
      _Var3._M_pi = extraout_RDX_00;
    }
  }
  if (local_48.source.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.source.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var3._M_pi = extraout_RDX_01;
  }
  sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<minja::Expression>)
         sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseLogicalNot() {
        static std::regex not_tok(R"(not\b)");
        auto location = get_location();

        if (!consumeToken(not_tok).empty()) {
          auto sub = parseLogicalNot();
          if (!sub) throw std::runtime_error("Expected expression after 'not' keyword");
          return std::make_shared<UnaryOpExpr>(location, std::move(sub), UnaryOpExpr::Op::LogicalNot);
        }
        return parseLogicalCompare();
    }